

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

uint32 er_hint_hash_fn(State *a,hash_fns_t *fns)

{
  uint uVar1;
  Rule *pRVar2;
  Term *pTVar3;
  uint uVar4;
  uint32 uVar5;
  Hint **ppHVar6;
  ulong uVar7;
  
  if ((a->error_recovery_hints).n != 0) {
    ppHVar6 = (a->error_recovery_hints).v;
    uVar7 = 0;
    uVar5 = 0;
    do {
      pRVar2 = ppHVar6[uVar7]->rule;
      pTVar3 = ((pRVar2->elems).v[(pRVar2->elems).n - 1]->e).term;
      uVar1 = ppHVar6[uVar7]->depth;
      uVar4 = strhashl(pTVar3->string,pTVar3->string_len);
      uVar5 = uVar4 + uVar1 * 0xd + uVar5 + 0xd;
      ppHVar6 = (a->error_recovery_hints).v;
      if (ppHVar6[uVar7]->rule != (Rule *)0x0) {
        uVar5 = uVar5 + ppHVar6[uVar7]->rule->prod->index * 0x2717;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (a->error_recovery_hints).n);
    return uVar5;
  }
  return 0;
}

Assistant:

static uint32 er_hint_hash_fn(State *a, hash_fns_t *fns) {
  VecHint *sa = &a->error_recovery_hints;
  uint32 hash = 0, i;
  Term *ta;
  (void)fns;

  for (i = 0; i < sa->n; i++) {
    ta = sa->v[i]->rule->elems.v[sa->v[i]->rule->elems.n - 1]->e.term;
    hash += (sa->v[i]->depth + 1) * 13;
    hash += strhashl(ta->string, ta->string_len);
    if (sa->v[i]->rule) hash += sa->v[i]->rule->prod->index * 10007;
  }
  return hash;
}